

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

float SVGChart::GetMaxFromRange(PlotDataBase *inData,long inStartIndex,long inEndIndex)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = 0.0;
  fVar3 = 0.0;
  for (lVar1 = 0; inStartIndex + lVar1 <= inEndIndex; lVar1 = lVar1 + 1) {
    if (lVar1 == 0) {
      fVar3 = PlotDataBase::GetValue(inData,inStartIndex);
      fVar4 = ABS(fVar3);
    }
    else {
      fVar2 = PlotDataBase::GetValue(inData,inStartIndex + lVar1);
      if (fVar4 < ABS(fVar2)) {
        fVar4 = ABS(fVar2);
        fVar3 = fVar2;
      }
    }
  }
  return fVar3;
}

Assistant:

float GetMaxFromRange (const PlotDataBase &inData, long inStartIndex, long inEndIndex) {
        float max = 0;
        float fabsMax = 0;
        for (long theI = inStartIndex; theI <= inEndIndex; theI++) {
            if (theI == inStartIndex) {
                max = inData.GetValue (theI);
                fabsMax = fabs (max);
            }
            else {
                float data = inData.GetValue (theI);
                if (fabs (data) > fabsMax) {
                    max = data;
                    fabsMax = fabs (data);
                }
            }
        }

        return max;
    }